

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O3

char * itochr(int i)

{
  char *__src;
  CharBuff *buff;
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  
  if (i == 0) {
    pcVar1 = "0";
  }
  else {
    uVar3 = (ulong)(uint)-i;
    if (0 < i) {
      uVar3 = (ulong)(uint)i;
    }
    buff = (CharBuff *)malloc(0x18);
    pcVar1 = (char *)malloc(0xc);
    buff->body = pcVar1;
    buff->init_size = 0xb;
    buff->len = 0;
    buff->buff_size = 0xb;
    pcVar1[7] = '\0';
    pcVar1[8] = '\0';
    pcVar1[9] = '\0';
    pcVar1[10] = '\0';
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    do {
      uVar2 = (uint)uVar3;
      sbuff_write(buff,(char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30);
      uVar3 = uVar3 / 10;
    } while (9 < uVar2);
    if (i < 0) {
      sbuff_write(buff,'-');
    }
    pcVar1 = (char *)calloc(1,(ulong)buff->len);
    __src = buff->body;
    strcpy(pcVar1,__src);
    free(__src);
    free(buff);
    reverse(pcVar1);
  }
  return pcVar1;
}

Assistant:

char *itochr(int i) {
    int num = abs(i);
    if (num == 0) return "0";
    CharBuff *buff = new_buff(10);
    int n;
    while (num > 0) {
        n = num % 10;
        append_chr(buff, (char) (n + '0'));
        num /= 10;
    }
    if (i < 0) {
        append_chr(buff, '-');
    }
    char *value = to_string(buff);
    free(buff->body);
    free(buff);
    return reverse(value);
}